

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

Builder * __thiscall
arangodb::velocypack::Builder::closeArray
          (Builder *this,ValueLength pos,iterator indexStart,iterator indexEnd)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  ValueLength VVar3;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  bool needIndexTable_00;
  uint8_t uVar4;
  unsigned_long *puVar5;
  iterator indexStart_00;
  Options *options;
  reference puVar6;
  long in_RSI;
  Builder *in_RDI;
  uint i_4;
  uint i_3;
  ValueLength x;
  size_t j;
  uint64_t x_1;
  size_t i_2;
  ValueLength tableBase;
  size_t i_1;
  ValueLength diff;
  ValueLength len;
  ValueLength targetPos;
  bool allowMemmove;
  uint offsetSize;
  size_t i;
  ValueLength subLen;
  bool buildIndexTable;
  bool needNrSubs;
  bool needIndexTable;
  size_t n;
  size_t in_stack_fffffffffffffe98;
  Builder *in_stack_fffffffffffffea0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  long local_140;
  ValueLength in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int iVar7;
  Options *in_stack_fffffffffffffed8;
  iterator in_stack_fffffffffffffee0;
  iterator indexEnd_00;
  iterator in_stack_fffffffffffffee8;
  Builder *in_stack_fffffffffffffef0;
  uint local_d0;
  uint local_cc;
  unsigned_long *local_c8;
  ulong local_c0;
  ulong local_b8;
  unsigned_long *local_b0;
  unsigned_long *local_a0;
  ulong local_88;
  bool local_5d;
  uint local_5c;
  ulong local_58;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_10;
  size_t local_8;
  
  __first._M_current._4_4_ = in_stack_fffffffffffffeb4;
  __first._M_current._0_4_ = in_stack_fffffffffffffeb0;
  puVar5 = (unsigned_long *)
           std::
           distance<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                     (__first,in_stack_fffffffffffffea8);
  needIndexTable_00 = true;
  if (puVar5 == (unsigned_long *)0x1) {
    needIndexTable_00 = false;
  }
  else {
    VVar3 = in_RDI->_pos;
    puVar6 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator[](&local_10,0);
    uVar1 = *puVar6;
    puVar6 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator[](&local_10,1);
    uVar2 = *puVar6;
    puVar6 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator[](&local_10,0);
    if ((VVar3 - in_RSI) - uVar1 == (long)puVar5 * (uVar2 - *puVar6)) {
      needIndexTable_00 = false;
      puVar6 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator[](&local_10,1);
      uVar1 = *puVar6;
      puVar6 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator[](&local_10,0);
      uVar2 = *puVar6;
      VVar3 = in_RDI->_pos;
      puVar6 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator[](&local_10,(long)puVar5 - 1);
      if ((VVar3 - in_RSI) - *puVar6 == uVar1 - uVar2) {
        for (local_58 = 1; local_58 < (long)puVar5 - 1U; local_58 = local_58 + 1) {
          puVar6 = __gnu_cxx::
                   __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator[](&local_10,local_58 + 1);
          in_stack_fffffffffffffef0 = (Builder *)*puVar6;
          puVar6 = __gnu_cxx::
                   __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator[](&local_10,local_58);
          if ((long)in_stack_fffffffffffffef0 - *puVar6 != uVar1 - uVar2) {
            needIndexTable_00 = true;
            break;
          }
        }
      }
      else {
        needIndexTable_00 = true;
      }
    }
  }
  local_5d = anon_unknown.dwarf_9e0b::isAllowedToMemmove
                       (in_stack_fffffffffffffed8,
                        (uint8_t *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                        in_stack_fffffffffffffec8);
  indexStart_00._M_current = (unsigned_long *)(in_RDI->_pos - in_RSI);
  indexEnd_00._M_current = puVar5;
  if (needIndexTable_00 == false) {
    indexEnd_00._M_current = (unsigned_long *)0x0;
  }
  options = (Options *)((long)indexStart_00._M_current + (long)indexEnd_00._M_current);
  if (local_5d) {
    iVar7 = 7;
    if (needIndexTable_00) {
      iVar7 = 6;
    }
  }
  else {
    iVar7 = 0;
  }
  if ((ulong)((long)options - (long)iVar7) < 0x100) {
    local_5c = 1;
  }
  else {
    local_5d = anon_unknown.dwarf_9e0b::isAllowedToMemmove
                         (options,(uint8_t *)CONCAT44(iVar7,in_stack_fffffffffffffed0),indexStart_00
                          ,indexEnd_00,in_stack_fffffffffffffec8);
    if (needIndexTable_00 == false) {
      local_140 = 0;
    }
    else {
      local_140 = (long)puVar5 << 1;
    }
    if (local_5d) {
      in_stack_fffffffffffffeb4 = 6;
      if (needIndexTable_00) {
        in_stack_fffffffffffffeb4 = 4;
      }
    }
    else {
      in_stack_fffffffffffffeb4 = 0;
    }
    if (((in_RDI->_pos - in_RSI) + local_140) - (long)in_stack_fffffffffffffeb4 < 0x10000) {
      local_5c = 2;
    }
    else {
      local_5d = false;
      in_stack_fffffffffffffea8._M_current = (unsigned_long *)(in_RDI->_pos - in_RSI);
      if (needIndexTable_00 == false) {
        in_stack_fffffffffffffea0 = (Builder *)0x0;
      }
      else {
        in_stack_fffffffffffffea0 = (Builder *)((long)puVar5 << 2);
      }
      if ((ulong)((long)in_stack_fffffffffffffea8._M_current + (long)in_stack_fffffffffffffea0) <
          0x100000000) {
        local_5c = 4;
      }
      else {
        local_5c = 8;
      }
    }
  }
  if (((local_5c < 8) && (needIndexTable_00 == false)) &&
     (in_RDI->options->paddingBehavior == UsePadding)) {
    local_5c = 8;
    local_5d = false;
  }
  uVar4 = anon_unknown.dwarf_9e0b::determineArrayType(needIndexTable_00,(ulong)local_5c);
  in_RDI->_start[in_RSI] = uVar4;
  if (local_5d != false) {
    local_88 = (ulong)(local_5c * 2 + 1);
    if (needIndexTable_00 == false) {
      local_88 = local_88 - local_5c;
    }
    if (in_RSI + 9U < in_RDI->_pos) {
      local_8 = in_RDI->_pos - (in_RSI + 9);
      memmove(in_RDI->_start + local_88 + in_RSI,in_RDI->_start + in_RSI + 9,local_8);
    }
    rollback(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    if (needIndexTable_00 != false) {
      for (local_a0 = (unsigned_long *)0x0; local_a0 < puVar5;
          local_a0 = (unsigned_long *)((long)local_a0 + 1)) {
        in_stack_fffffffffffffe98 = 9 - local_88;
        puVar6 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator[](&local_10,(difference_type)local_a0);
        *puVar6 = *puVar6 - in_stack_fffffffffffffe98;
      }
    }
  }
  if (needIndexTable_00 != false) {
    reserve((Builder *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
            (ValueLength)in_stack_fffffffffffffea8._M_current);
    VVar3 = in_RDI->_pos;
    advance(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    for (local_b0 = (unsigned_long *)0x0; local_b0 < puVar5;
        local_b0 = (unsigned_long *)((long)local_b0 + 1)) {
      puVar6 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator[](&local_10,(difference_type)local_b0);
      local_b8 = *puVar6;
      for (local_c0 = 0; local_c0 < local_5c; local_c0 = local_c0 + 1) {
        in_RDI->_start[VVar3 + (ulong)local_5c * (long)local_b0 + local_c0] = (uint8_t)local_b8;
        local_b8 = local_b8 >> 8;
      }
    }
  }
  if ((local_5c == 8) && (needIndexTable_00)) {
    reserve((Builder *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
            (ValueLength)in_stack_fffffffffffffea8._M_current);
    appendLengthUnchecked<8ul>
              ((Builder *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (ValueLength)in_stack_fffffffffffffea8._M_current);
  }
  local_c8 = (unsigned_long *)(in_RDI->_pos - in_RSI);
  for (local_cc = 1; local_cc <= local_5c; local_cc = local_cc + 1) {
    in_RDI->_start[in_RSI + (ulong)local_cc] = (uint8_t)local_c8;
    local_c8 = (unsigned_long *)((ulong)local_c8 >> 8);
  }
  if ((local_5c < 8) && (local_c8 = puVar5, local_d0 = local_5c, needIndexTable_00)) {
    while (local_d0 = local_d0 + 1, local_d0 <= local_5c * 2) {
      in_RDI->_start[in_RSI + (ulong)local_d0] = (uint8_t)local_c8;
      local_c8 = (unsigned_long *)((ulong)local_c8 >> 8);
    }
  }
  closeLevel(in_stack_fffffffffffffef0);
  return in_RDI;
}

Assistant:

Builder& Builder::closeArray(ValueLength pos,
                             std::vector<ValueLength>::iterator indexStart,
                             std::vector<ValueLength>::iterator indexEnd) {
  std::size_t const n = std::distance(indexStart, indexEnd);
  VELOCYPACK_ASSERT(n > 0);

  bool needIndexTable = true;
  bool needNrSubs = true;

  if (n == 1) {
    // just one array entry
    needIndexTable = false;
    needNrSubs = false;
  } else if ((_pos - pos) - indexStart[0] ==
             n * (indexStart[1] - indexStart[0])) {
    // In this case it could be that all entries have the same length
    // and we do not need an offset table at all:
    bool buildIndexTable = false;
    ValueLength const subLen = indexStart[1] - indexStart[0];
    if ((_pos - pos) - indexStart[n - 1] != subLen) {
      buildIndexTable = true;
    } else {
      for (std::size_t i = 1; i < n - 1; i++) {
        if (indexStart[i + 1] - indexStart[i] != subLen) {
          // different lengths
          buildIndexTable = true;
          break;
        }
      }
    }

    if (!buildIndexTable) {
      needIndexTable = false;
      needNrSubs = false;
    }
  }

  VELOCYPACK_ASSERT(needIndexTable == needNrSubs);

  // First determine byte length and its format:
  unsigned int offsetSize;
  // can be 1, 2, 4 or 8 for the byte width of the offsets,
  // the byte length and the number of subvalues:
  bool allowMemmove =
      ::isAllowedToMemmove(options, _start + pos, indexStart, indexEnd, 1);
  if (_pos - pos + (needIndexTable ? n : 0) -
          (allowMemmove ? (needNrSubs ? 6 : 7) : 0) <=
      0xff) {
    // We have so far used _pos - pos bytes, including the reserved 8
    // bytes for byte length and number of subvalues. In the 1-byte number
    // case we would win back 6 bytes but would need one byte per subvalue
    // for the index table
    offsetSize = 1;
  } else {
    allowMemmove =
        ::isAllowedToMemmove(options, _start + pos, indexStart, indexEnd, 2);
    if (_pos - pos + (needIndexTable ? 2 * n : 0) -
            (allowMemmove ? (needNrSubs ? 4 : 6) : 0) <=
        0xffff) {
      offsetSize = 2;
    } else {
      allowMemmove = false;
      if (_pos - pos + (needIndexTable ? 4 * n : 0) <= 0xffffffffu) {
        offsetSize = 4;
      } else {
        offsetSize = 8;
      }
    }
  }

  VELOCYPACK_ASSERT(offsetSize == 1 || offsetSize == 2 || offsetSize == 4 ||
                    offsetSize == 8);
  VELOCYPACK_ASSERT(!allowMemmove || offsetSize == 1 || offsetSize == 2);

  if (offsetSize < 8 && !needIndexTable &&
      options->paddingBehavior == Options::PaddingBehavior::UsePadding) {
    // if we are allowed to use padding, we will pad to 8 bytes anyway. as we
    // are not using an index table, we can also use type 0x05 for all Arrays
    // without making things worse space-wise
    offsetSize = 8;
    allowMemmove = false;
  }

  // fix head byte
  _start[pos] = ::determineArrayType(needIndexTable, offsetSize);

  // Maybe we need to move down data:
  if (allowMemmove) {
    // check if one of the first entries in the array is ValueType::None
    // (0x00). in this case, we could not distinguish between a None (0x00)
    // and the optional padding. so we must prevent the memmove here
    ValueLength targetPos = 1 + 2 * offsetSize;
    if (!needIndexTable) {
      targetPos -= offsetSize;
    }
    if (_pos > (pos + 9)) {
      ValueLength len = _pos - (pos + 9);
      memmove(_start + pos + targetPos, _start + pos + 9, checkOverflow(len));
    }
    ValueLength const diff = 9 - targetPos;
    rollback(diff);
    if (needIndexTable) {
      for (std::size_t i = 0; i < n; i++) {
        indexStart[i] -= diff;
      }
    }  // Note: if !needIndexTable the index array is now wrong!
  }

  // Now build the table:
  if (needIndexTable) {
    reserve(offsetSize * n + (offsetSize == 8 ? 8 : 0));
    ValueLength tableBase = _pos;
    advance(offsetSize * n);
    for (std::size_t i = 0; i < n; i++) {
      uint64_t x = indexStart[i];
      for (std::size_t j = 0; j < offsetSize; j++) {
        _start[tableBase + offsetSize * i + j] = x & 0xff;
        x >>= 8;
      }
    }
  }

  // Finally fix the byte width at tthe end:
  if (offsetSize == 8 && needNrSubs) {
    reserve(8);
    appendLengthUnchecked<8>(n);
  }

  // Fix the byte length in the beginning:
  ValueLength x = _pos - pos;
  for (unsigned int i = 1; i <= offsetSize; i++) {
    _start[pos + i] = x & 0xff;
    x >>= 8;
  }

  if (offsetSize < 8 && needNrSubs) {
    x = n;
    for (unsigned int i = offsetSize + 1; i <= 2 * offsetSize; i++) {
      _start[pos + i] = x & 0xff;
      x >>= 8;
    }
  }

  // Now the array or object is complete, we pop a ValueLength
  // off the _stack:
  closeLevel();
  return *this;
}